

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::CompactEnd<true>(List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_> *pWVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = (this->
          super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
          ).count;
  if (iVar6 != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pWVar4 = (this->
               super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr;
      iVar6 = iVar6 + -1;
      lVar5 = (long)iVar6;
      if (pWVar4[lVar5].ptr == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                           ,0x1bd,"(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr))",
                           "!weaklyRefItems || (this->buffer[this->count - 1] != nullptr)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        pWVar4 = (this->
                 super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr;
        iVar6 = (this->
                super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
                ).count + -1;
        lVar5 = (long)iVar6;
      }
      if (((pWVar4[lVar5].ptr)->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) {
        return pWVar4[lVar5].ptr;
      }
      (this->
      super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
      ).count = iVar6;
      pWVar4[lVar5].ptr = (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
    } while (iVar6 != 0);
  }
  return (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
}

Assistant:

T CompactEnd()
        {
            while (this->count != 0)
            {
                AnalysisAssert(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr));
                if (weaklyRefItems ?
                    this->buffer[this->count - 1]->Get() != nullptr :
                    this->buffer[this->count - 1] != nullptr)
                {
                    return this->buffer[this->count - 1];
                }
                this->count--;
                this->buffer[this->count] = nullptr;
            }

            return nullptr;
        }